

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

void __thiscall
soul::AST::EndpointDeclaration::EndpointDeclaration
          (EndpointDeclaration *this,Allocator *a,Context *c,bool isInputEndpoint,EndpointType type)

{
  EndpointDetails *o;
  EndpointType local_28;
  byte local_21;
  EndpointType type_local;
  bool isInputEndpoint_local;
  Context *c_local;
  Allocator *a_local;
  EndpointDeclaration *this_local;
  
  local_28 = type;
  local_21 = isInputEndpoint;
  _type_local = c;
  c_local = (Context *)a;
  a_local = (Allocator *)this;
  ASTObject::ASTObject(&this->super_ASTObject,EndpointDeclaration,c);
  (this->super_ASTObject)._vptr_ASTObject = (_func_int **)&PTR__EndpointDeclaration_005869f0;
  this->isInput = (bool)(local_21 & 1);
  Identifier::Identifier(&this->name);
  o = Allocator::allocate<soul::AST::EndpointDetails,soul::EndpointType&>
                ((Allocator *)c_local,&local_28);
  pool_ptr<soul::AST::EndpointDetails>::pool_ptr<soul::AST::EndpointDetails,void>(&this->details,o);
  pool_ptr<soul::AST::ChildEndpointPath>::pool_ptr(&this->childPath);
  Annotation::Annotation(&this->annotation);
  this->needsToBeExposedInParent = false;
  this->isConsoleEndpoint = false;
  pool_ptr<soul::heart::InputDeclaration>::pool_ptr(&this->generatedInput);
  pool_ptr<soul::heart::OutputDeclaration>::pool_ptr(&this->generatedOutput);
  return;
}

Assistant:

EndpointDeclaration (Allocator& a, const Context& c, bool isInputEndpoint, EndpointType type)
            : ASTObject (ObjectType::EndpointDeclaration, c), isInput (isInputEndpoint),
                         details (a.allocate<EndpointDetails> (type)) {}